

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  bool value;
  AbstractSocketWriter *pAVar1;
  long in_FS_OFFSET;
  UnitTest *unit_test_local;
  StreamingListener *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  value = UnitTest::Passed(unit_test);
  FormatBool_abi_cxx11_((string *)&this_local,this,value);
  std::operator+(&local_30,"event=TestProgramEnd&passed=",(string *)&this_local);
  SendLn(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&this_local);
  pAVar1 = scoped_ptr<testing::internal::StreamingListener::AbstractSocketWriter>::operator->
                     (&this->socket_writer_);
  (*pAVar1->_vptr_AbstractSocketWriter[3])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    SendLn("event=TestProgramEnd&passed=" + FormatBool(unit_test.Passed()));

    // Notify the streaming server to stop.
    socket_writer_->CloseConnection();
  }